

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

Handle __thiscall
dg::vr::ValueRelations::newPlaceholderBucket<llvm::Value_const*>(ValueRelations *this,Value **from)

{
  pointer prVar1;
  HandlePtr pBVar2;
  Bucket *pBVar3;
  key_type local_18;
  
  pBVar2 = maybeGet(this,*from);
  if ((pBVar2 == (HandlePtr)0x0) ||
     (prVar1 = (pBVar2->relatedBuckets)._M_elems[10].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     prVar1 == (pBVar2->relatedBuckets)._M_elems[10].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    pBVar3 = RelationsGraph<dg::vr::ValueRelations>::getNewBucket(&this->graph);
    local_18._M_data = pBVar3;
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
    ::operator[](&this->bucketToVals,&local_18);
  }
  else {
    pBVar3 = prVar1->_M_data;
  }
  return pBVar3;
}

Assistant:

Handle newPlaceholderBucket(const X &from) {
        HandlePtr mH = maybeGet(from);
        if (mH && mH->hasRelation(Relations::PT)) {
            return mH->getRelated(Relations::PT);
        }

        Handle h = graph.getNewBucket();
        bucketToVals[h];
        return h;
    }